

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

size_t __thiscall player_t::PropagateMark(player_t *this)

{
  anon_union_8_2_947301c6 anon_var_0;
  AWeapon *local_18;
  
  local_18 = (AWeapon *)this->mo;
  GC::Mark((DObject **)&local_18);
  this->mo = (APlayerPawn *)local_18;
  GC::Mark((DObject **)&this->poisoner);
  GC::Mark((DObject **)&this->attacker);
  GC::Mark((DObject **)&this->camera);
  GC::Mark((DObject **)&this->Bot);
  local_18 = this->ReadyWeapon;
  GC::Mark((DObject **)&local_18);
  this->ReadyWeapon = local_18;
  GC::Mark((DObject **)&this->ConversationNPC);
  GC::Mark((DObject **)&this->ConversationPC);
  GC::Mark((DObject **)&this->MUSINFOactor);
  GC::Mark((DObject **)&this->PremorphWeapon);
  GC::Mark((DObject **)&this->psprites);
  local_18 = this->PendingWeapon;
  if (local_18 != (AWeapon *)AWeapon::RegistrationInfo.MyClass) {
    GC::Mark((DObject **)&local_18);
    this->PendingWeapon = local_18;
  }
  return 0x2a0;
}

Assistant:

size_t player_t::PropagateMark()
{
	GC::Mark(mo);
	GC::Mark(poisoner);
	GC::Mark(attacker);
	GC::Mark(camera);
	GC::Mark(Bot);
	GC::Mark(ReadyWeapon);
	GC::Mark(ConversationNPC);
	GC::Mark(ConversationPC);
	GC::Mark(MUSINFOactor);
	GC::Mark(PremorphWeapon);
	GC::Mark(psprites);
	if (PendingWeapon != WP_NOCHANGE)
	{
		GC::Mark(PendingWeapon);
	}
	return sizeof(*this);
}